

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall tcu::x11::glx::Rank::add(Rank *this,size_t bits,deUint32 value)

{
  deUint64 dVar1;
  deBool dVar2;
  uint uVar3;
  InternalError *this_00;
  deUint32 value_local;
  size_t bits_local;
  Rank *this_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (this->m_bitsLeft < bits)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      this->m_bitsLeft = this->m_bitsLeft - bits;
      dVar1 = this->m_value;
      uVar3 = de::min<unsigned_int>((1 << ((byte)bits & 0x1f)) - 1,value);
      this->m_value = dVar1 << ((byte)bits & 0x3f) | (ulong)uVar3;
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this_00,(char *)0x0,"m_bitsLeft >= bits",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x202);
  __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

void Rank::add (size_t bits, deUint32 value)
{
	TCU_CHECK_INTERNAL(m_bitsLeft >= bits);
	m_bitsLeft -= bits;
	m_value = m_value << bits | de::min((1U << bits) - 1, value);
}